

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O0

bool __thiscall
EmmyFacade::RegisterTypeName(EmmyFacade *this,lua_State *L,string *typeName,string *err)

{
  bool bVar1;
  element_type *this_00;
  bool suc;
  undefined1 local_40 [8];
  shared_ptr<Debugger> debugger;
  string *err_local;
  string *typeName_local;
  lua_State *L_local;
  EmmyFacade *this_local;
  
  debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)err;
  GetDebugger((EmmyFacade *)local_40,(lua_State *)this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_40);
    this_local._7_1_ =
         Debugger::RegisterTypeName
                   (this_00,typeName,
                    (string *)
                    debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)
               debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
               "Debugger does not exist");
    this_local._7_1_ = false;
  }
  std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool EmmyFacade::RegisterTypeName(lua_State *L, const std::string &typeName, std::string &err) {
	auto debugger = GetDebugger(L);
	if (!debugger) {
		err = "Debugger does not exist";
		return false;
	}
	const auto suc = debugger->RegisterTypeName(typeName, err);
	return suc;
}